

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPathCommand.cxx
# Opt level: O2

string * __thiscall
cmFindPathCommand::FindNormalHeader_abi_cxx11_
          (string *__return_storage_ptr__,cmFindPathCommand *this)

{
  bool bVar1;
  pointer pbVar2;
  pointer pbVar3;
  string tryPath;
  allocator local_51;
  char *local_50;
  size_type local_48;
  char local_40;
  undefined7 uStack_3f;
  undefined8 uStack_38;
  
  local_48 = 0;
  local_40 = '\0';
  pbVar3 = (this->super_cmFindBase).Names.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_50 = &local_40;
  do {
    if (pbVar3 == (this->super_cmFindBase).Names.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_51);
LAB_002f7ead:
      std::__cxx11::string::~string((string *)&local_50);
      return __return_storage_ptr__;
    }
    for (pbVar2 = (this->super_cmFindBase).super_cmFindCommon.SearchPaths.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar2 != (this->super_cmFindBase).super_cmFindCommon.SearchPaths.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar2 = pbVar2 + 1) {
      std::__cxx11::string::_M_assign((string *)&local_50);
      std::__cxx11::string::append((string *)&local_50);
      bVar1 = cmsys::SystemTools::FileExists(local_50);
      if (bVar1) {
        if ((this->super_cmFindBase).field_0x242 == '\x01') {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          if (local_50 == &local_40) {
            (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_3f,local_40);
            *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_38;
          }
          else {
            (__return_storage_ptr__->_M_dataplus)._M_p = local_50;
            (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_3f,local_40);
          }
          __return_storage_ptr__->_M_string_length = local_48;
          local_48 = 0;
          local_40 = '\0';
          local_50 = &local_40;
        }
        else {
          std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pbVar2);
        }
        goto LAB_002f7ead;
      }
    }
    pbVar3 = pbVar3 + 1;
  } while( true );
}

Assistant:

std::string cmFindPathCommand::FindNormalHeader()
{
  std::string tryPath;
  for(std::vector<std::string>::const_iterator ni = this->Names.begin();
      ni != this->Names.end() ; ++ni)
    {
    for(std::vector<std::string>::const_iterator
          p = this->SearchPaths.begin();
        p != this->SearchPaths.end(); ++p)
      {
      tryPath = *p;
      tryPath += *ni;
      if(cmSystemTools::FileExists(tryPath.c_str()))
        {
        if(this->IncludeFileInPath)
          {
          return tryPath;
          }
        else
          {
          return *p;
          }
        }
      }
    }
  return "";
}